

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_CHARACTER::Convert(_Type_CHARACTER *this,Variable *obj,Type *type)

{
  bool bVar1;
  char32_t c;
  Character *this_00;
  String *this_01;
  Object *pOVar2;
  Type *in_RCX;
  uint *extraout_RDX;
  Variable VVar4;
  String local_50;
  undefined1 local_29;
  Type *type_local;
  Variable *obj_local;
  _Type_CHARACTER *this_local;
  Variable *res;
  uint *puVar3;
  
  type_local = type;
  obj_local = obj;
  this_local = this;
  bVar1 = Type::operator==(in_RCX,(Type *)_type_string);
  if (bVar1) {
    local_29 = 0;
    pOVar2 = Variable::operator->((Variable *)type_local);
    Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    pOVar2 = Variable::operator->((Variable *)type_local);
    this_00 = Object::GetData<LiteScript::Character>(pOVar2);
    c = Character::operator_cast_to_char32_t(this_00);
    String::String(&local_50,c);
    pOVar2 = Variable::operator->((Variable *)this);
    this_01 = Object::GetData<LiteScript::String>(pOVar2);
    String::operator=(this_01,&local_50);
    String::~String(&local_50);
    puVar3 = extraout_RDX;
  }
  else {
    pOVar2 = Variable::operator->((Variable *)type_local);
    VVar4 = Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    puVar3 = VVar4.nb_ref;
  }
  VVar4.nb_ref = puVar3;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CHARACTER::Convert(const LiteScript::Variable& obj, const LiteScript::Type& type) const {
    if (type == Type::STRING) {
        Variable res = obj->memory.Create(Type::STRING);
        res->GetData<String>() = String(obj->GetData<Character>());
        return res;
    }
    else {
        return obj->memory.Create(Type::NIL);
    }
}